

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O2

void __thiscall FNodeBuilder::CreateSubsectorsForReal(FNodeBuilder *this)

{
  uint uVar1;
  USegPtr *pUVar2;
  uint uVar3;
  ulong uVar4;
  uint i;
  seg_t *psVar5;
  USegPtr ptr;
  TArray<subsector_t,_subsector_t> *local_a0;
  subsector_t local_98;
  
  local_98.flags = 0;
  local_98.render_sector = (sector_t *)0x0;
  local_a0 = &this->Subsectors;
  local_98.sector = (sector_t *)0x0;
  local_98.polys = (FPolyNode *)0x0;
  local_98.BSP = (FMiniBSP *)0x0;
  for (uVar4 = 0; uVar4 < (this->SubsectorSets).Count; uVar4 = uVar4 + 1) {
    uVar1 = (this->SegList).Count;
    psVar5 = (seg_t *)(ulong)uVar1;
    uVar3 = (this->SubsectorSets).Array[uVar4];
    while (uVar3 != 0xffffffff) {
      ptr.SegPtr = (this->Segs).Array + uVar3;
      TArray<FNodeBuilder::USegPtr,_FNodeBuilder::USegPtr>::Push(&this->SegList,&ptr);
      uVar3 = (ptr.SegPtr)->next;
    }
    local_98.numlines = (this->SegList).Count - uVar1;
    local_98.firstline = psVar5;
    qsort((this->SegList).Array + (long)psVar5,(ulong)local_98.numlines,8,SortSegs);
    for (; psVar5 < (seg_t *)(ulong)(this->SegList).Count; psVar5 = (seg_t *)((long)&psVar5->v1 + 1)
        ) {
      pUVar2 = (this->SegList).Array;
      pUVar2[(long)psVar5].SegNum =
           (DWORD)(((long)pUVar2[(long)psVar5].SegPtr - (long)(this->Segs).Array) / 0x48);
    }
    TArray<subsector_t,_subsector_t>::Push(local_a0,&local_98);
  }
  return;
}

Assistant:

void FNodeBuilder::CreateSubsectorsForReal ()
{
	subsector_t sub;
	unsigned int i;

	sub.sector = NULL;
	sub.polys = NULL;
	sub.BSP = NULL;
	sub.flags = 0;
	sub.render_sector = NULL;

	for (i = 0; i < SubsectorSets.Size(); ++i)
	{
		DWORD set = SubsectorSets[i];
		DWORD firstline = (DWORD)SegList.Size();

		while (set != DWORD_MAX)
		{
			USegPtr ptr;

			ptr.SegPtr = &Segs[set];
			SegList.Push (ptr);
			set = ptr.SegPtr->next;
		}
		sub.numlines = (DWORD)(SegList.Size() - firstline);
		sub.firstline = (seg_t *)(size_t)firstline;

		// Sort segs by linedef for special effects
		qsort (&SegList[firstline], sub.numlines, sizeof(USegPtr), SortSegs);

		// Convert seg pointers into indices
		D(Printf (PRINT_LOG, "Output subsector %d:\n", Subsectors.Size()));
		for (unsigned int i = firstline; i < SegList.Size(); ++i)
		{
			D(Printf (PRINT_LOG, "  Seg %5d%c%d(%5d,%5d)-%d(%5d,%5d)  [%08x,%08x]-[%08x,%08x]\n", SegList[i].SegPtr - &Segs[0],
				SegList[i].SegPtr->linedef == -1 ? '+' : ' ',
				SegList[i].SegPtr->v1,
				Vertices[SegList[i].SegPtr->v1].x>>16,
				Vertices[SegList[i].SegPtr->v1].y>>16,
				SegList[i].SegPtr->v2,
				Vertices[SegList[i].SegPtr->v2].x>>16,
				Vertices[SegList[i].SegPtr->v2].y>>16,
				Vertices[SegList[i].SegPtr->v1].x, Vertices[SegList[i].SegPtr->v1].y,
				Vertices[SegList[i].SegPtr->v2].x, Vertices[SegList[i].SegPtr->v2].y));
			SegList[i].SegNum = DWORD(SegList[i].SegPtr - &Segs[0]);
		}
		Subsectors.Push (sub);
	}
}